

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O3

void test_bhdct_get_exist_single(planck_unit_test_t *tc)

{
  ion_dictionary_t dict;
  ion_dictionary_handler_t handler;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 local_84;
  ion_dictionary_t local_80;
  ion_dictionary_handler_t local_68;
  
  bhdct_setup(tc,&local_68,&local_80,ion_fill_none);
  local_84 = 0x1e;
  local_88 = 0x1e;
  bhdct_insert(tc,&local_80,&local_84,&local_88,'\x01');
  local_8c = 0x1e;
  local_90 = 0x1e;
  bhdct_get(tc,&local_80,&local_8c,&local_90,'\0',1);
  bhdct_delete_dictionary(tc,&local_80);
  bhdct_close_master_table(tc);
  bhdct_delete_master_table(tc);
  return;
}

Assistant:

void
test_bhdct_get_exist_single(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;

	bhdct_setup(tc, &handler, &dict, ion_fill_none);

	bhdct_insert(tc, &dict, IONIZE(30, int), IONIZE(30, int), boolean_true);
	bhdct_get(tc, &dict, IONIZE(30, int), IONIZE(30, int), err_ok, 1);

	bhdct_takedown(tc, &dict);
}